

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::VerifySignatureRequest,cfd::js::api::json::VerifySignatureResponse,cfd::js::api::VerifySignatureRequestStruct,cfd::js::api::VerifySignatureResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&)>
          *elements_function)

{
  ErrorResponse local_8f8;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_840 [4];
  JsonClassBase<cfd::js::api::json::VerifySignatureResponse> local_820 [4];
  undefined1 local_800 [8];
  VerifySignatureResponse res_2;
  VerifySignatureResponseStruct local_7b8;
  VerifySignatureResponseStruct local_708;
  undefined1 local_658 [8];
  VerifySignatureResponseStruct response;
  VerifySignatureRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_200 [8];
  VerifySignatureRequest req;
  function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&)>
  *elements_function_local;
  function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&)>
  *bitcoin_function_local;
  string *request_message_local;
  string *json_message;
  
  req.utxos_.super_JsonVector<cfd::js::api::json::UtxoObject>.
  super_vector<cfd::js::api::json::UtxoObject,_std::allocator<cfd::js::api::json::UtxoObject>_>.
  super__Vector_base<cfd::js::api::json::UtxoObject,_std::allocator<cfd::js::api::json::UtxoObject>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)elements_function;
  VerifySignatureRequest::VerifySignatureRequest((VerifySignatureRequest *)local_200);
  core::JsonClassBase<cfd::js::api::json::VerifySignatureRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::VerifySignatureRequest> *)local_200,request_message)
  ;
  VerifySignatureRequest::ConvertToStruct
            ((VerifySignatureRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (VerifySignatureRequest *)local_200);
  VerifySignatureResponseStruct::VerifySignatureResponseStruct
            ((VerifySignatureResponseStruct *)local_658);
  if ((request._24_1_ & 1) == 0) {
    std::
    function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&)>
    ::operator()(&local_7b8,bitcoin_function,
                 (VerifySignatureRequestStruct *)
                 &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    VerifySignatureResponseStruct::operator=((VerifySignatureResponseStruct *)local_658,&local_7b8);
    VerifySignatureResponseStruct::~VerifySignatureResponseStruct(&local_7b8);
  }
  else {
    std::
    function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&)>
    ::operator()(&local_708,elements_function,
                 (VerifySignatureRequestStruct *)
                 &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    VerifySignatureResponseStruct::operator=((VerifySignatureResponseStruct *)local_658,&local_708);
    VerifySignatureResponseStruct::~VerifySignatureResponseStruct(&local_708);
  }
  res_2._63_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._0_4_ == 0) {
    VerifySignatureResponse::VerifySignatureResponse((VerifySignatureResponse *)local_800);
    VerifySignatureResponse::ConvertFromStruct
              ((VerifySignatureResponse *)local_800,(VerifySignatureResponseStruct *)local_658);
    core::JsonClassBase<cfd::js::api::json::VerifySignatureResponse>::Serialize_abi_cxx11_
              (local_820);
    std::__cxx11::string::operator=((string *)this,(string *)local_820);
    std::__cxx11::string::~string((string *)local_820);
    VerifySignatureResponse::~VerifySignatureResponse((VerifySignatureResponse *)local_800);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_8f8,(InnerErrorResponseStruct *)&response);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_840);
    std::__cxx11::string::operator=((string *)this,(string *)local_840);
    std::__cxx11::string::~string((string *)local_840);
    ErrorResponse::~ErrorResponse(&local_8f8);
  }
  res_2._63_1_ = 1;
  VerifySignatureResponseStruct::~VerifySignatureResponseStruct
            ((VerifySignatureResponseStruct *)local_658);
  VerifySignatureRequestStruct::~VerifySignatureRequestStruct
            ((VerifySignatureRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  VerifySignatureRequest::~VerifySignatureRequest((VerifySignatureRequest *)local_200);
  return this;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}